

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O3

ExprNode * __thiscall Translator::visit(Translator *this,PrimaryNode *primaryNode)

{
  ExpNode *pEVar1;
  int iVar2;
  VarSymbol *pVVar3;
  undefined4 extraout_var;
  ExprNode *pEVar4;
  undefined4 extraout_var_00;
  Label *pLVar5;
  MEM *this_00;
  NAME *this_01;
  Literal *this_02;
  TokenNode *pTVar6;
  double dVar7;
  char name [200];
  char acStack_e8 [200];
  
  pTVar6 = primaryNode->token;
  if ((pTVar6 == (TokenNode *)0x0) || (pTVar6->token != 10)) {
    pEVar1 = primaryNode->exp;
    if (pEVar1 != (ExpNode *)0x0) {
      iVar2 = (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[4])(pEVar1,this);
      return (ExprNode *)CONCAT44(extraout_var_00,iVar2);
    }
    iVar2 = pTVar6->token;
    if (iVar2 < 0x36) {
      if (iVar2 != 0x1e) {
        if (iVar2 == 0x1f) {
          pEVar4 = (ExprNode *)operator_new(0x10);
          CONST::CONST((CONST *)pEVar4,1);
          return pEVar4;
        }
        if (iVar2 != 0x20) {
          return (ExprNode *)0x0;
        }
        pEVar4 = (ExprNode *)operator_new(0x10);
        CONST::CONST((CONST *)pEVar4,0);
        return pEVar4;
      }
    }
    else if (iVar2 != 0x38) {
      if (iVar2 == 0x37) {
        pEVar4 = (ExprNode *)operator_new(0x10);
        dVar7 = atof((pTVar6->super_ExpNode).lexeme);
        CONSTF::CONSTF((CONSTF *)pEVar4,(float)dVar7);
        return pEVar4;
      }
      if (iVar2 != 0x36) {
        return (ExprNode *)0x0;
      }
      pEVar4 = (ExprNode *)operator_new(0x10);
      iVar2 = atoi((pTVar6->super_ExpNode).lexeme);
      CONST::CONST((CONST *)pEVar4,iVar2);
      return pEVar4;
    }
    this_02 = (Literal *)operator_new(0x18);
    Literal::Literal(this_02,(pTVar6->super_ExpNode).lexeme);
    (this_02->super_Fragment).next = this->fragmentList;
    this->fragmentList = (Fragment *)this_02;
    this_00 = (MEM *)operator_new(0x18);
    pLVar5 = (Label *)operator_new(0x10);
    Label::Label(pLVar5,(primaryNode->token->super_ExpNode).lexeme);
    NAME::NAME((NAME *)this_00,pLVar5);
  }
  else {
    if (this->activeFunction != (FunctionSymbol *)0x0) {
      pVVar3 = VarTable::searchInScope
                         (this->varTable,(pTVar6->super_ExpNode).lexeme,
                          (this->activeFunction->super_Symbol).lexeme);
      pTVar6 = primaryNode->token;
      if (pVVar3 != (VarSymbol *)0x0) {
        iVar2 = (*(this->currentFrame->super_Frame)._vptr_Frame[1])
                          (this->currentFrame,0,(ulong)(uint)pTVar6->size);
        pEVar4 = (ExprNode *)
                 (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
                           ((undefined8 *)CONCAT44(extraout_var,iVar2));
        return pEVar4;
      }
    }
    pVVar3 = VarTable::cSearch(this->varTable,(pTVar6->super_ExpNode).lexeme);
    if (pVVar3 == (VarSymbol *)0x0) {
      this_00 = (MEM *)0x0;
    }
    else {
      sprintf(acStack_e8,"nonLocal_var_%s",(primaryNode->token->super_ExpNode).lexeme);
      pLVar5 = (Label *)operator_new(0x10);
      Label::Label(pLVar5,acStack_e8);
      this_00 = (MEM *)operator_new(0x18);
      this_01 = (NAME *)operator_new(0x18);
      NAME::NAME(this_01,pLVar5);
      MEM::MEM(this_00,(ExprNode *)this_01);
    }
  }
  return &this_00->super_ExprNode;
}

Assistant:

ExprNode *Translator::visit(PrimaryNode *primaryNode) {//TODO checar casos de arranjos?
    //checa se eh ID
    if (primaryNode->getTokenNode() && primaryNode->getTokenNode()->getToken() == ID) {
        VarSymbol *aux;
        if (activeFunction) {
            aux = varTable->searchInScope(primaryNode->getTokenNode()->getLexeme(), activeFunction->getLexeme());
        }
        if (aux)// variavel local
        {
            //TODO verificar corretude
            LocalAccess *tmp = this->currentFrame->addLocal(false, primaryNode->getTokenNode()->getSize());
            return tmp->accessCode();
//            return new BINOP(PLUS, new TEMP(FP), new CONST(aux->getOffset()));
        } else {
            aux = varTable->cSearch(primaryNode->getTokenNode()->getLexeme());
            if (aux) {// var nonLocal
                char name[200];
                sprintf(name, "nonLocal_var_%s", primaryNode->getTokenNode()->getLexeme());
                Label *labelAUX = new Label(name);
                return new MEM(new NAME(labelAUX));
            }
        }
    } else // nao eh ID
    {
        //checa se eh expressao
        if (primaryNode->getExp()) {
            return primaryNode->getExp()->accept(this);
        }
        //checa se eh um primitivo
        if (primaryNode->getTokenNode()->getToken() == NUMINT) {
            return new CONST(atoi(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == NUMFLOAT) {
            return new CONSTF(atof(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == LITERALCHAR ||
            primaryNode->getTokenNode()->getToken() == LITERAL) {
            Literal *literal = new Literal(primaryNode->getTokenNode()->getLexeme());
            //TODO verificar
            literal->setNext(fragmentList);
            fragmentList = literal;
            return new NAME(new Label(primaryNode->getTokenNode()->getLexeme()));
        }

        if (primaryNode->getTokenNode()->getToken() == TRUE) {
            return new CONST(1);
        }

        if (primaryNode->getTokenNode()->getToken() == FALSE) {
            return new CONST(0);
        }
    }

    return NULL;
}